

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_4_channels_with_6_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *local_2e0;
  float *local_2c8;
  stbir__contributors *local_2c0;
  float fStack_1d4;
  float local_1c8;
  float fStack_1ac;
  float fStack_1a0;
  float fStack_194;
  float local_188;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  
  local_2e0 = output_buffer;
  local_2c8 = horizontal_coefficients;
  local_2c0 = horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (local_2c0->n0 << 2);
    local_188 = (float)*(undefined8 *)local_2c8;
    local_d8 = (float)*(undefined8 *)pfVar1;
    fStack_d4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_d0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_cc = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_194 = (float)((ulong)*(undefined8 *)local_2c8 >> 0x20);
    local_f8 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_f4 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_ec = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(local_2c8 + 2);
    local_118 = (float)*(undefined8 *)(pfVar1 + 8);
    fStack_114 = (float)((ulong)*(undefined8 *)(pfVar1 + 8) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_10c = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_1ac = (float)((ulong)*(undefined8 *)(local_2c8 + 2) >> 0x20);
    local_138 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_134 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_12c = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    local_1c8 = (float)*(undefined8 *)(local_2c8 + 4);
    local_158 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_154 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(pfVar1 + 0x12);
    fStack_14c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x12) >> 0x20);
    fStack_1d4 = (float)((ulong)*(undefined8 *)(local_2c8 + 4) >> 0x20);
    local_178 = (float)*(undefined8 *)(pfVar1 + 0x14);
    fStack_174 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x14) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(pfVar1 + 0x16);
    fStack_16c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x16) >> 0x20);
    *(ulong *)local_2e0 =
         CONCAT44(local_188 * fStack_d4 + fStack_1a0 * fStack_114 + local_1c8 * fStack_154 +
                  fStack_194 * fStack_f4 + fStack_1ac * fStack_134 + fStack_1d4 * fStack_174,
                  local_188 * local_d8 + fStack_1a0 * local_118 + local_1c8 * local_158 +
                  fStack_194 * local_f8 + fStack_1ac * local_138 + fStack_1d4 * local_178);
    *(ulong *)(local_2e0 + 2) =
         CONCAT44(local_188 * fStack_cc + fStack_1a0 * fStack_10c + local_1c8 * fStack_14c +
                  fStack_194 * fStack_ec + fStack_1ac * fStack_12c + fStack_1d4 * fStack_16c,
                  local_188 * fStack_d0 + fStack_1a0 * fStack_110 + local_1c8 * fStack_150 +
                  fStack_194 * fStack_f0 + fStack_1ac * fStack_130 + fStack_1d4 * fStack_170);
    local_2c8 = local_2c8 + coefficient_width;
    local_2c0 = local_2c0 + 1;
    local_2e0 = local_2e0 + 4;
  } while (local_2e0 < output_buffer + (output_sub_size << 2));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_6_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__2_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}